

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threefish256Block.c
# Opt level: O1

void threefishDecrypt256(ThreefishKey_t *keyCtx,uint64_t *input,uint64_t *output)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  u64b_t uVar6;
  u64b_t uVar7;
  u64b_t uVar8;
  u64b_t uVar9;
  u64b_t uVar10;
  u64b_t uVar11;
  u64b_t uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar6 = keyCtx->key[0];
  uVar7 = keyCtx->key[1];
  uVar8 = keyCtx->key[2];
  uVar9 = keyCtx->key[3];
  uVar14 = keyCtx->key[4];
  uVar10 = keyCtx->tweak[0];
  uVar11 = keyCtx->tweak[1];
  lVar1 = uVar10 + uVar14;
  lVar2 = uVar11 + uVar6;
  uVar16 = (input[3] - uVar7) - 0x12 ^ *input - uVar9;
  uVar17 = uVar16 << 0x20 | uVar16 >> 0x20;
  uVar16 = (*input - uVar9) - uVar17;
  uVar13 = input[1] - lVar1 ^ input[2] - lVar2;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar15 = (input[2] - lVar2) - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x2a | uVar17 >> 0x16;
  uVar15 = uVar15 - uVar17;
  uVar17 = uVar17 ^ uVar16;
  uVar17 = uVar17 << 0x12 | uVar17 >> 0x2e;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 ^ uVar15;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar16 = (uVar16 - uVar8) - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x1f | uVar17 >> 0x21;
  uVar15 = (uVar15 - lVar1) - uVar17;
  uVar12 = keyCtx->tweak[2];
  lVar3 = uVar9 + uVar12;
  uVar17 = (uVar17 - uVar6) - 0x11 ^ uVar16;
  uVar17 = uVar17 << 0x3b | uVar17 >> 5;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 - lVar3 ^ uVar15;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x18 | uVar17 >> 0x28;
  uVar15 = uVar15 - uVar17;
  uVar17 = uVar17 ^ uVar16;
  uVar17 = uVar17 << 0xc | uVar17 >> 0x34;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 ^ uVar15;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar7) - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x30 | uVar17 >> 0x10;
  uVar15 = (uVar15 - lVar3) - uVar17;
  lVar4 = uVar11 + uVar8;
  uVar17 = (uVar17 - uVar14) - 0x10 ^ uVar16;
  uVar17 = uVar17 << 0x20 | uVar17 >> 0x20;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 - lVar4 ^ uVar15;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x2a | uVar17 >> 0x16;
  uVar15 = uVar15 - uVar17;
  uVar17 = uVar17 ^ uVar16;
  uVar17 = uVar17 << 0x12 | uVar17 >> 0x2e;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 ^ uVar15;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x1f | uVar17 >> 0x21;
  uVar16 = (uVar16 - uVar6) - uVar13;
  uVar15 = (uVar15 - lVar4) - uVar17;
  lVar5 = uVar10 + uVar7;
  uVar17 = (uVar17 - uVar9) - 0xf ^ uVar16;
  uVar17 = uVar17 << 0x3b | uVar17 >> 5;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 - lVar5 ^ uVar15;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar17 = uVar17 << 0x18 | uVar17 >> 0x28;
  uVar15 = uVar15 - uVar17;
  uVar17 = uVar17 ^ uVar16;
  uVar17 = uVar17 << 0xc | uVar17 >> 0x34;
  uVar16 = uVar16 - uVar17;
  uVar13 = uVar13 ^ uVar15;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar15 = uVar15 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar14) - uVar13;
  uVar17 = uVar17 ^ uVar15;
  uVar18 = uVar17 << 0x30 | uVar17 >> 0x10;
  uVar17 = (uVar15 - lVar5) - uVar18;
  uVar15 = (uVar18 - uVar8) - 0xe ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar6 + uVar12) ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar16 = (uVar16 - uVar9) - uVar13;
  uVar17 = uVar17 - (uVar6 + uVar12 + uVar15);
  uVar15 = (uVar15 - uVar7) - 0xd ^ uVar16;
  uVar15 = uVar15 << 0x3b | uVar15 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar11 + uVar14) ^ uVar17;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0xc | uVar15 >> 0x34;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar8) - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uVar17 = uVar17 - (uVar11 + uVar14 + uVar15);
  uVar15 = (uVar15 - uVar6) - 0xc ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar10 + uVar9) ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar16 = (uVar16 - uVar7) - uVar13;
  uVar17 = uVar17 - (uVar10 + uVar9 + uVar15);
  uVar15 = (uVar15 - uVar14) - 0xb ^ uVar16;
  uVar15 = uVar15 << 0x3b | uVar15 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar8 + uVar12) ^ uVar17;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0xc | uVar15 >> 0x34;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar6) - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uVar17 = uVar17 - (uVar8 + uVar12 + uVar15);
  uVar15 = (uVar15 - uVar9) - 10 ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar11 + uVar7) ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar16 = (uVar16 - uVar14) - uVar13;
  uVar17 = uVar17 - (uVar11 + uVar7 + uVar15);
  uVar15 = (uVar15 - uVar8) - 9 ^ uVar16;
  uVar15 = uVar15 << 0x3b | uVar15 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar10 + uVar6) ^ uVar17;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0xc | uVar15 >> 0x34;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar9) - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uVar17 = uVar17 - (uVar10 + uVar6 + uVar15);
  uVar15 = (uVar15 - uVar7) - 8 ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar14 + uVar12) ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar16 = (uVar16 - uVar8) - uVar13;
  uVar17 = uVar17 - (uVar14 + uVar12 + uVar15);
  uVar15 = (uVar15 - uVar6) - 7 ^ uVar16;
  uVar15 = uVar15 << 0x3b | uVar15 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar11 + uVar9) ^ uVar17;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0xc | uVar15 >> 0x34;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar7) - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uVar17 = uVar17 - (uVar11 + uVar9 + uVar15);
  uVar15 = (uVar15 - uVar14) - 6 ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar10 + uVar8) ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar16 = (uVar16 - uVar6) - uVar13;
  uVar17 = uVar17 - (uVar10 + uVar8 + uVar15);
  uVar15 = (uVar15 - uVar9) - 5 ^ uVar16;
  uVar15 = uVar15 << 0x3b | uVar15 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - (uVar12 + uVar7) ^ uVar17;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0xc | uVar15 >> 0x34;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = (uVar16 - uVar14) - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uVar17 = uVar17 - (uVar12 + uVar7 + uVar15);
  uVar15 = (uVar15 - uVar8) - 4 ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - lVar2 ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar16 = (uVar16 - uVar9) - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar17 = uVar17 - (lVar2 + uVar15);
  uVar15 = (uVar15 - uVar7) - 3 ^ uVar16;
  uVar15 = uVar15 << 0x3b | uVar15 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - lVar1 ^ uVar17;
  uVar13 = uVar13 << 0x1b | uVar13 >> 0x25;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x29 | uVar13 >> 0x17;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0xc | uVar15 >> 0x34;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 7 | uVar13 >> 0x39;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x32 | uVar13 >> 0xe;
  uVar16 = uVar16 - (uVar8 + uVar13);
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x30 | uVar15 >> 0x10;
  uVar17 = uVar17 - (lVar1 + uVar15);
  uVar15 = (uVar15 - uVar6) - 2 ^ uVar16;
  uVar15 = uVar15 << 0x20 | uVar15 >> 0x20;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 - lVar3 ^ uVar17;
  uVar13 = uVar13 << 0x20 | uVar13 >> 0x20;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 6 | uVar13 >> 0x3a;
  uVar16 = uVar16 - uVar13;
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x2a | uVar15 >> 0x16;
  uVar17 = uVar17 - uVar15;
  uVar15 = uVar15 ^ uVar16;
  uVar15 = uVar15 << 0x12 | uVar15 >> 0x2e;
  uVar16 = uVar16 - uVar15;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x34 | uVar13 >> 0xc;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0x27 | uVar13 >> 0x19;
  uVar16 = uVar16 - (uVar7 + uVar13);
  uVar15 = uVar15 ^ uVar17;
  uVar15 = uVar15 << 0x1f | uVar15 >> 0x21;
  uVar17 = uVar17 - (lVar3 + uVar15);
  uVar14 = ~uVar14 + uVar15 ^ uVar16;
  uVar15 = uVar14 << 0x3b | uVar14 >> 5;
  uVar16 = uVar16 - uVar15;
  uVar14 = uVar13 - lVar4 ^ uVar17;
  uVar14 = uVar14 << 0x1b | uVar14 >> 0x25;
  uVar17 = uVar17 - uVar14;
  uVar14 = uVar14 ^ uVar16;
  uVar14 = uVar14 << 0x29 | uVar14 >> 0x17;
  uVar16 = uVar16 - uVar14;
  uVar15 = uVar15 ^ uVar17;
  uVar13 = uVar15 << 0x18 | uVar15 >> 0x28;
  uVar17 = uVar17 - uVar13;
  uVar13 = uVar13 ^ uVar16;
  uVar13 = uVar13 << 0xc | uVar13 >> 0x34;
  uVar16 = uVar16 - uVar13;
  uVar14 = uVar14 ^ uVar17;
  uVar14 = uVar14 << 7 | uVar14 >> 0x39;
  uVar17 = uVar17 - uVar14;
  uVar14 = uVar14 ^ uVar16;
  uVar14 = uVar14 << 0x32 | uVar14 >> 0xe;
  uVar13 = uVar13 ^ uVar17;
  uVar13 = uVar13 << 0x30 | uVar13 >> 0x10;
  *output = uVar16 - (uVar6 + uVar14);
  output[1] = uVar14 - lVar5;
  output[2] = uVar17 - (lVar4 + uVar13);
  output[3] = uVar13 - uVar9;
  return;
}

Assistant:

void threefishDecrypt256(ThreefishKey_t* keyCtx, uint64_t* input, uint64_t* output)
  {
    uint64_t b0 = input[0], b1 = input[1],
      b2 = input[2], b3 = input[3];
    uint64_t k0 = keyCtx->key[0], k1 = keyCtx->key[1],
      k2 = keyCtx->key[2], k3 = keyCtx->key[3],
      k4 = keyCtx->key[4];
    uint64_t t0 = keyCtx->tweak[0], t1 = keyCtx->tweak[1],
      t2 = keyCtx->tweak[2];

    uint64_t tmp;

    b0 -= k3;
    b1 -= k4 + t0;
    b2 -= k0 + t1;
    b3 -= k1 + 18;
    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k2; b1 -= k3 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k4 + t0; b3 -= k0 + 17;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k1; b1 -= k2 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k3 + t2; b3 -= k4 + 16;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k0; b1 -= k1 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k2 + t1; b3 -= k3 + 15;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k4; b1 -= k0 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k1 + t0; b3 -= k2 + 14;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k3; b1 -= k4 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k0 + t2; b3 -= k1 + 13;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k2; b1 -= k3 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k4 + t1; b3 -= k0 + 12;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k1; b1 -= k2 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k3 + t0; b3 -= k4 + 11;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k0; b1 -= k1 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k2 + t2; b3 -= k3 + 10;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k4; b1 -= k0 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k1 + t1; b3 -= k2 + 9;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k3; b1 -= k4 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k0 + t0; b3 -= k1 + 8;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k2; b1 -= k3 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k4 + t2; b3 -= k0 + 7;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k1; b1 -= k2 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k3 + t1; b3 -= k4 + 6;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k0; b1 -= k1 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k2 + t0; b3 -= k3 + 5;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k4; b1 -= k0 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k1 + t2; b3 -= k2 + 4;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k3; b1 -= k4 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k0 + t1; b3 -= k1 + 3;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k2; b1 -= k3 + t2;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k4 + t0; b3 -= k0 + 2;

    tmp = b3 ^ b0; b3 = (tmp >> 32) | (tmp << (64 - 32)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 32) | (tmp << (64 - 32)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 58) | (tmp << (64 - 58)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 22) | (tmp << (64 - 22)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 46) | (tmp << (64 - 46)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 12) | (tmp << (64 - 12)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 25) | (tmp << (64 - 25)); b0 -= b1 + k1; b1 -= k2 + t1;
    tmp = b3 ^ b2; b3 = (tmp >> 33) | (tmp << (64 - 33)); b2 -= b3 + k3 + t2; b3 -= k4 + 1;
    tmp = b3 ^ b0; b3 = (tmp >> 5) | (tmp << (64 - 5)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 37) | (tmp << (64 - 37)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 23) | (tmp << (64 - 23)); b0 -= b1;
    tmp = b3 ^ b2; b3 = (tmp >> 40) | (tmp << (64 - 40)); b2 -= b3;
    tmp = b3 ^ b0; b3 = (tmp >> 52) | (tmp << (64 - 52)); b0 -= b3;
    tmp = b1 ^ b2; b1 = (tmp >> 57) | (tmp << (64 - 57)); b2 -= b1;
    tmp = b1 ^ b0; b1 = (tmp >> 14) | (tmp << (64 - 14)); b0 -= b1 + k0; b1 -= k1 + t0;
    tmp = b3 ^ b2; b3 = (tmp >> 16) | (tmp << (64 - 16)); b2 -= b3 + k2 + t1; b3 -= k3;

    output[0] = b0;
    output[1] = b1;
    output[2] = b2;
    output[3] = b3;
  }